

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkSpirVProgram.hpp
# Opt level: O0

SpirVAsmSource * vk::operator<<(SpirVAsmSource *src,char (*val) [6486])

{
  string local_38;
  char (*local_18) [6486];
  char (*val_local) [6486];
  SpirVAsmSource *src_local;
  
  local_18 = val;
  val_local = (char (*) [6486])src;
  de::toString<char[6486]>(&local_38,val);
  std::__cxx11::string::operator+=((string *)val_local,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (SpirVAsmSource *)val_local;
}

Assistant:

SpirVAsmSource& operator<< (SpirVAsmSource& src, const T& val)
{
	src.source += de::toString(val);
	return src;
}